

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O2

ssize_t __thiscall serial::Serial::write(Serial *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  undefined4 in_register_00000034;
  ScopedWriteLock lock;
  ScopedWriteLock local_18;
  
  local_18.pimpl_ = this->pimpl_;
  SerialImpl::writeLock(local_18.pimpl_);
  sVar1 = write_(this,*(uint8_t **)CONCAT44(in_register_00000034,__fd),
                 ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1]);
  ScopedWriteLock::~ScopedWriteLock(&local_18);
  return sVar1;
}

Assistant:

size_t
Serial::write (const string &data)
{
  ScopedWriteLock lock(this->pimpl_);
  return this->write_ (reinterpret_cast<const uint8_t*>(data.c_str()),
                       data.length());
}